

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int UTF8ToUTF16LE(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  ushort *puVar1;
  byte bVar2;
  byte *pbVar3;
  uchar *processed;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  unsigned_short *out;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  iVar7 = (int)outb;
  iVar5 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      pbVar9 = in;
      if (0 < (long)*inlen) {
        pbVar8 = in + *inlen;
        puVar1 = (ushort *)(outb + (long)(*outlen / 2) * 2);
        do {
          bVar2 = *pbVar9;
          uVar4 = (uint)bVar2;
          lVar6 = 0;
          if ((char)bVar2 < '\0') {
            if (bVar2 < 0xc0) {
LAB_001445b0:
              *outlen = (int)outb - iVar7;
              *inlen = (int)pbVar9 - (int)in;
              return -2;
            }
            if (bVar2 < 0xe0) {
              uVar4 = bVar2 & 0x1f;
              lVar6 = 1;
            }
            else if (bVar2 < 0xf0) {
              uVar4 = bVar2 & 0xf;
              lVar6 = 2;
            }
            else {
              if (0xf7 < bVar2) goto LAB_001445b0;
              uVar4 = bVar2 & 7;
              lVar6 = 3;
            }
          }
          pbVar10 = pbVar9 + 1;
          iVar5 = (int)lVar6;
          if ((long)pbVar8 - (long)pbVar10 < lVar6) break;
          if (pbVar10 < pbVar8 && (char)bVar2 < '\0') {
            pbVar3 = pbVar9 + 2;
            do {
              pbVar10 = pbVar3;
              iVar5 = iVar5 + -1;
              if (((pbVar10[-1] & 0xffffffc0) != 0x80) ||
                 (uVar4 = pbVar10[-1] & 0x3f | uVar4 << 6, iVar5 == 0)) break;
              pbVar3 = pbVar10 + 1;
            } while (pbVar10 < pbVar8);
          }
          if (uVar4 < 0x10000) {
            if (puVar1 <= outb) break;
            *(ushort *)outb = (ushort)uVar4;
            outb = (uchar *)((long)outb + 2);
          }
          else {
            if ((0x10ffff < uVar4) || (puVar1 <= (ushort *)((long)outb + 2))) break;
            *(ushort *)outb = (ushort)(uVar4 + 0xff0000 >> 10) | 0xd800;
            *(ushort *)((long)outb + 2) = (ushort)uVar4 & 0x3ff | 0xdc00;
            outb = (uchar *)((long)outb + 4);
          }
          pbVar9 = pbVar10;
          if (pbVar8 <= pbVar10) break;
        } while( true );
      }
      *outlen = (int)outb - iVar7;
      *inlen = (int)pbVar9 - (int)in;
      return *outlen;
    }
    iVar5 = 0;
    *outlen = 0;
    *inlen = 0;
  }
  return iVar5;
}

Assistant:

static int
UTF8ToUTF16LE(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    unsigned short* out = (unsigned short*) outb;
    const unsigned char* processed = in;
    const unsigned char *const instart = in;
    unsigned short* outstart= out;
    unsigned short* outend;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;
    unsigned char *tmp;
    unsigned short tmp1, tmp2;

    /* UTF16LE encoding has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend= in + *inlen;
    outend = out + (*outlen / 2);
    while (in < inend) {
      d= *in++;
      if      (d < 0x80)  { c= d; trailing= 0; }
      else if (d < 0xC0) {
          /* trailing byte in leading position */
	  *outlen = (out - outstart) * 2;
	  *inlen = processed - instart;
	  return(-2);
      } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
      else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
      else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
      else {
	/* no chance for this in UTF-16 */
	*outlen = (out - outstart) * 2;
	*inlen = processed - instart;
	return(-2);
      }

      if (inend - in < trailing) {
          break;
      }

      for ( ; trailing; trailing--) {
          if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))
	      break;
          c <<= 6;
          c |= d & 0x3F;
      }

      /* assertion: c is a single UTF-4 value */
        if (c < 0x10000) {
            if (out >= outend)
	        break;
	    if (xmlLittleEndian) {
		*out++ = c;
	    } else {
		tmp = (unsigned char *) out;
		*tmp = c ;
		*(tmp + 1) = c >> 8 ;
		out++;
	    }
        }
        else if (c < 0x110000) {
            if (out+1 >= outend)
	        break;
            c -= 0x10000;
	    if (xmlLittleEndian) {
		*out++ = 0xD800 | (c >> 10);
		*out++ = 0xDC00 | (c & 0x03FF);
	    } else {
		tmp1 = 0xD800 | (c >> 10);
		tmp = (unsigned char *) out;
		*tmp = (unsigned char) tmp1;
		*(tmp + 1) = tmp1 >> 8;
		out++;

		tmp2 = 0xDC00 | (c & 0x03FF);
		tmp = (unsigned char *) out;
		*tmp  = (unsigned char) tmp2;
		*(tmp + 1) = tmp2 >> 8;
		out++;
	    }
        }
        else
	    break;
	processed = in;
    }
    *outlen = (out - outstart) * 2;
    *inlen = processed - instart;
    return(*outlen);
}